

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
           *this)

{
  size_t *psVar1;
  size_t i_00;
  bool bVar2;
  ctrl_t cVar3;
  int *ts;
  size_t sVar4;
  size_t sVar5;
  allocator_type *paVar6;
  FindInfo FVar7;
  undefined1 local_60 [8];
  anon_class_16_2_f7bee600 probe_index;
  size_t new_i;
  FindInfo target;
  undefined1 local_30 [8];
  size_t hashval;
  size_t i;
  slot_type *slot;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  *prStack_10;
  type raw;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  *this_local;
  
  prStack_10 = this;
  bVar2 = IsValidCapacity(this->capacity_);
  if (!bVar2) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<int>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<int>]"
                 );
  }
  bVar2 = is_small(this);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,this->capacity_);
    i = (long)&slot + 4;
    hashval = 0;
    do {
      if (hashval == this->capacity_) {
        reset_growth_left(this,this->capacity_);
        return;
      }
      bVar2 = IsDeleted(this->ctrl_[hashval]);
      if (bVar2) {
        target.probe_length = (size_t)hash_ref(this);
        ts = hash_policy_traits<phmap::priv::FlatHashSetPolicy<int>,void>::
             element<phmap::priv::FlatHashSetPolicy<int>>(this->slots_ + hashval);
        local_30 = (undefined1  [8])
                   hash_policy_traits<phmap::priv::FlatHashSetPolicy<int>,void>::
                   apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>::HashElement,int&,phmap::priv::FlatHashSetPolicy<int>>
                             ((HashElement *)&target.probe_length,ts);
        FVar7 = find_first_non_full(this,(size_t)local_30);
        new_i = FVar7.offset;
        probe_index.hashval = (size_t *)new_i;
        probe_index.this =
             (raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              *)local_30;
        local_60 = (undefined1  [8])this;
        sVar4 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                          ((anon_class_16_2_f7bee600 *)local_60,new_i);
        sVar5 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                          ((anon_class_16_2_f7bee600 *)local_60,hashval);
        i_00 = hashval;
        if (sVar4 == sVar5) {
          cVar3 = H2((size_t)local_30);
          set_ctrl(this,i_00,cVar3);
        }
        else {
          bVar2 = IsEmpty(this->ctrl_[(long)probe_index.hashval]);
          psVar1 = probe_index.hashval;
          if (bVar2) {
            cVar3 = H2((size_t)local_30);
            set_ctrl(this,(size_t)psVar1,cVar3);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<int>,void>::
            transfer<std::allocator<int>>
                      (paVar6,this->slots_ + (long)probe_index.hashval,this->slots_ + hashval);
            set_ctrl(this,hashval,-0x80);
          }
          else {
            bVar2 = IsDeleted(this->ctrl_[(long)probe_index.hashval]);
            psVar1 = probe_index.hashval;
            if (!bVar2) {
              __assert_fail("IsDeleted(ctrl_[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                            ,0x853,
                            "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<int>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<int>]"
                           );
            }
            cVar3 = H2((size_t)local_30);
            set_ctrl(this,(size_t)psVar1,cVar3);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<int>,void>::
            transfer<std::allocator<int>>(paVar6,(slot_type *)i,this->slots_ + hashval);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<int>,void>::
            transfer<std::allocator<int>>
                      (paVar6,this->slots_ + hashval,this->slots_ + (long)probe_index.hashval);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::priv::FlatHashSetPolicy<int>,void>::
            transfer<std::allocator<int>>
                      (paVar6,this->slots_ + (long)probe_index.hashval,(slot_type *)i);
            hashval = hashval - 1;
          }
        }
      }
      hashval = hashval + 1;
    } while( true );
  }
  __assert_fail("!is_small()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x823,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<int>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<int>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }